

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O1

void RegisterNetRPCCommands(CRPCTable *t)

{
  string category;
  string category_00;
  string category_01;
  string category_02;
  string category_03;
  string category_04;
  string category_05;
  string category_06;
  string category_07;
  string category_08;
  string category_09;
  string category_10;
  string category_11;
  string category_12;
  string category_13;
  string category_14;
  string category_15;
  string category_16;
  int iVar1;
  CRPCCommand *pcmd;
  long lVar2;
  long in_FS_OFFSET;
  undefined8 in_stack_fffffffffffffd88;
  undefined1 *puVar3;
  undefined8 in_stack_fffffffffffffd90;
  long in_stack_fffffffffffffd98;
  undefined8 in_stack_fffffffffffffda0;
  long *local_258 [2];
  long local_248 [2];
  long *local_238 [2];
  long local_228 [2];
  long *local_218 [2];
  long local_208 [2];
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8 [2];
  long local_1a8 [2];
  long *local_198 [2];
  long local_188 [2];
  long *local_178 [2];
  long local_168 [2];
  long *local_158 [2];
  long local_148 [2];
  long *local_138 [2];
  long local_128 [2];
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  long *local_98 [2];
  long local_88 [2];
  long *local_78 [2];
  long local_68 [2];
  long *local_58 [2];
  long local_48 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (RegisterNetRPCCommands(CRPCTable&)::commands == '\0') {
    iVar1 = __cxa_guard_acquire(&RegisterNetRPCCommands(CRPCTable&)::commands);
    if (iVar1 != 0) {
      local_58[0] = local_48;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"network","");
      category._M_string_length = in_stack_fffffffffffffd90;
      category._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
      category.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand(RegisterNetRPCCommands::commands,category,(RpcMethodFnType)local_58);
      local_78[0] = local_68;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"network","");
      category_00._M_string_length = in_stack_fffffffffffffd90;
      category_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
      category_00.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category_00.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 1,category_00,(RpcMethodFnType)local_78);
      local_98[0] = local_88;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"network","");
      category_01._M_string_length = in_stack_fffffffffffffd90;
      category_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
      category_01.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category_01.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 2,category_01,(RpcMethodFnType)local_98);
      local_b8[0] = local_a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"network","");
      category_02._M_string_length = in_stack_fffffffffffffd90;
      category_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
      category_02.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category_02.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 3,category_02,(RpcMethodFnType)local_b8);
      local_d8[0] = local_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"network","");
      category_03._M_string_length = in_stack_fffffffffffffd90;
      category_03._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
      category_03.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category_03.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 4,category_03,(RpcMethodFnType)local_d8);
      local_f8[0] = local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"network","");
      category_04._M_string_length = in_stack_fffffffffffffd90;
      category_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
      category_04.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category_04.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 5,category_04,(RpcMethodFnType)local_f8);
      local_118[0] = local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"network","");
      category_05._M_string_length = in_stack_fffffffffffffd90;
      category_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
      category_05.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category_05.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 6,category_05,(RpcMethodFnType)local_118);
      local_138[0] = local_128;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"network","");
      category_06._M_string_length = in_stack_fffffffffffffd90;
      category_06._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
      category_06.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category_06.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 7,category_06,(RpcMethodFnType)local_138);
      local_158[0] = local_148;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"network","");
      category_07._M_string_length = in_stack_fffffffffffffd90;
      category_07._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
      category_07.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category_07.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 8,category_07,(RpcMethodFnType)local_158);
      local_178[0] = local_168;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"network","");
      category_08._M_string_length = in_stack_fffffffffffffd90;
      category_08._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
      category_08.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category_08.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 9,category_08,(RpcMethodFnType)local_178);
      local_198[0] = local_188;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"network","");
      category_09._M_string_length = in_stack_fffffffffffffd90;
      category_09._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
      category_09.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category_09.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 10,category_09,(RpcMethodFnType)local_198);
      local_1b8[0] = local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"network","");
      category_10._M_string_length = in_stack_fffffffffffffd90;
      category_10._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
      category_10.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category_10.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 0xb,category_10,(RpcMethodFnType)local_1b8);
      local_1d8[0] = local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"network","");
      category_11._M_string_length = in_stack_fffffffffffffd90;
      category_11._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
      category_11.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category_11.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 0xc,category_11,(RpcMethodFnType)local_1d8);
      local_1f8[0] = local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"network","");
      category_12._M_string_length = in_stack_fffffffffffffd90;
      category_12._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
      category_12.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category_12.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 0xd,category_12,(RpcMethodFnType)local_1f8);
      local_218[0] = local_208;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"hidden","");
      category_13._M_string_length = in_stack_fffffffffffffd90;
      category_13._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
      category_13.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category_13.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 0xe,category_13,(RpcMethodFnType)local_218);
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"hidden","");
      category_14._M_string_length = in_stack_fffffffffffffd90;
      category_14._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
      category_14.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category_14.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 0xf,category_14,(RpcMethodFnType)local_238);
      local_258[0] = local_248;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"hidden","");
      category_15._M_string_length = in_stack_fffffffffffffd90;
      category_15._M_dataplus._M_p = (pointer)in_stack_fffffffffffffd88;
      category_15.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category_15.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 0x10,category_15,(RpcMethodFnType)local_258);
      puVar3 = &stack0xfffffffffffffd98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&stack0xfffffffffffffd88,"hidden","");
      category_16._M_string_length = in_stack_fffffffffffffd90;
      category_16._M_dataplus._M_p = puVar3;
      category_16.field_2._M_allocated_capacity = in_stack_fffffffffffffd98;
      category_16.field_2._8_8_ = in_stack_fffffffffffffda0;
      CRPCCommand::CRPCCommand
                (RegisterNetRPCCommands::commands + 0x11,category_16,
                 (RpcMethodFnType)&stack0xfffffffffffffd88);
      if (puVar3 != &stack0xfffffffffffffd98) {
        operator_delete(puVar3,in_stack_fffffffffffffd98 + 1);
      }
      if (local_258[0] != local_248) {
        operator_delete(local_258[0],local_248[0] + 1);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0],local_228[0] + 1);
      }
      if (local_218[0] != local_208) {
        operator_delete(local_218[0],local_208[0] + 1);
      }
      if (local_1f8[0] != local_1e8) {
        operator_delete(local_1f8[0],local_1e8[0] + 1);
      }
      if (local_1d8[0] != local_1c8) {
        operator_delete(local_1d8[0],local_1c8[0] + 1);
      }
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0],local_1a8[0] + 1);
      }
      if (local_198[0] != local_188) {
        operator_delete(local_198[0],local_188[0] + 1);
      }
      if (local_178[0] != local_168) {
        operator_delete(local_178[0],local_168[0] + 1);
      }
      if (local_158[0] != local_148) {
        operator_delete(local_158[0],local_148[0] + 1);
      }
      if (local_138[0] != local_128) {
        operator_delete(local_138[0],local_128[0] + 1);
      }
      if (local_118[0] != local_108) {
        operator_delete(local_118[0],local_108[0] + 1);
      }
      if (local_f8[0] != local_e8) {
        operator_delete(local_f8[0],local_e8[0] + 1);
      }
      if (local_d8[0] != local_c8) {
        operator_delete(local_d8[0],local_c8[0] + 1);
      }
      if (local_b8[0] != local_a8) {
        operator_delete(local_b8[0],local_a8[0] + 1);
      }
      if (local_98[0] != local_88) {
        operator_delete(local_98[0],local_88[0] + 1);
      }
      if (local_78[0] != local_68) {
        operator_delete(local_78[0],local_68[0] + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&RegisterNetRPCCommands(CRPCTable&)::commands);
    }
  }
  lVar2 = 0x900;
  pcmd = RegisterNetRPCCommands::commands;
  do {
    CRPCTable::appendCommand(t,&pcmd->name,pcmd);
    pcmd = pcmd + 1;
    lVar2 = lVar2 + -0x80;
  } while (lVar2 != 0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RegisterNetRPCCommands(CRPCTable& t)
{
    static const CRPCCommand commands[]{
        {"network", &getconnectioncount},
        {"network", &ping},
        {"network", &getpeerinfo},
        {"network", &addnode},
        {"network", &disconnectnode},
        {"network", &getaddednodeinfo},
        {"network", &getnettotals},
        {"network", &getnetworkinfo},
        {"network", &setban},
        {"network", &listbanned},
        {"network", &clearbanned},
        {"network", &setnetworkactive},
        {"network", &getnodeaddresses},
        {"network", &getaddrmaninfo},
        {"hidden", &addconnection},
        {"hidden", &addpeeraddress},
        {"hidden", &sendmsgtopeer},
        {"hidden", &getrawaddrman},
    };
    for (const auto& c : commands) {
        t.appendCommand(c.name, &c);
    }
}